

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

bool tinyusdz::is_close(matrix2f *a,matrix2f *b,float eps)

{
  bool bVar1;
  bool local_1d;
  float eps_local;
  matrix2f *b_local;
  matrix2f *a_local;
  
  bVar1 = math::is_close(a->m[0][0],b->m[0][0],eps);
  local_1d = false;
  if (bVar1) {
    bVar1 = math::is_close(a->m[0][1],b->m[0][1],eps);
    local_1d = false;
    if (bVar1) {
      bVar1 = math::is_close(a->m[1][0],b->m[1][0],eps);
      local_1d = false;
      if (bVar1) {
        local_1d = math::is_close(a->m[1][1],b->m[1][1],eps);
      }
    }
  }
  return local_1d;
}

Assistant:

bool is_close(const value::matrix2f &a, const value::matrix2f &b, const float eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps);
}